

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_ACS_Terminate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  level_info_t *plVar1;
  FString *pFVar2;
  
  if (arg1 == 0) {
    pFVar2 = &level.MapName;
  }
  else {
    plVar1 = FindLevelByNum(arg1);
    if (plVar1 == (level_info_t *)0x0) {
      return 1;
    }
    pFVar2 = &plVar1->MapName;
  }
  P_TerminateScript(arg0,pFVar2->Chars);
  return 1;
}

Assistant:

FUNC(LS_ACS_Terminate)
// ACS_Terminate (script, map)
{
	level_info_t *info;

	if (arg1 == 0)
		P_TerminateScript (arg0, level.MapName);
	else if ((info = FindLevelByNum (arg1)) )
		P_TerminateScript (arg0, info->MapName);

	return true;
}